

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::code_coefficients_pass_one(jpeg_encoder *this,int component_num)

{
  uint32 (*pauVar1) [256];
  uint32 (*local_58) [256];
  uint32 *ac_count;
  uint32 *dc_count;
  int16 *src;
  int local_20;
  int temp1;
  int nbits;
  int run_len;
  int i;
  int component_num_local;
  jpeg_encoder *this_local;
  
  if (component_num < 3) {
    if (component_num == 0) {
      pauVar1 = this->m_huff_count;
      local_58 = this->m_huff_count + 2;
    }
    else {
      pauVar1 = this->m_huff_count + 1;
      local_58 = this->m_huff_count + 3;
    }
    src._4_4_ = (int)this->m_coefficient_array[0] - this->m_last_dc_val[component_num];
    this->m_last_dc_val[component_num] = (int)this->m_coefficient_array[0];
    if (src._4_4_ < 0) {
      src._4_4_ = -src._4_4_;
    }
    local_20 = 0;
    for (; src._4_4_ != 0; src._4_4_ = src._4_4_ >> 1) {
      local_20 = local_20 + 1;
    }
    (*pauVar1)[local_20] = (*pauVar1)[local_20] + 1;
    temp1 = 0;
    for (nbits = 1; nbits < 0x40; nbits = nbits + 1) {
      src._4_4_ = (int)this->m_coefficient_array[nbits];
      if (src._4_4_ == 0) {
        temp1 = temp1 + 1;
      }
      else {
        for (; 0xf < temp1; temp1 = temp1 + -0x10) {
          (*local_58)[0xf0] = (*local_58)[0xf0] + 1;
        }
        if (src._4_4_ < 0) {
          src._4_4_ = -src._4_4_;
        }
        local_20 = 1;
        while (src._4_4_ = src._4_4_ >> 1, src._4_4_ != 0) {
          local_20 = local_20 + 1;
        }
        local_20 = temp1 * 0x10 + local_20;
        (*local_58)[local_20] = (*local_58)[local_20] + 1;
        temp1 = 0;
      }
    }
    if (temp1 != 0) {
      (*local_58)[0] = (*local_58)[0] + 1;
    }
  }
  return;
}

Assistant:

void jpeg_encoder::code_coefficients_pass_one(int component_num)
{
  if (component_num >= 3) return; // just to shut up static analysis
  int i, run_len, nbits, temp1;
  int16 *src = m_coefficient_array;
  uint32 *dc_count = component_num ? m_huff_count[0 + 1] : m_huff_count[0 + 0], *ac_count = component_num ? m_huff_count[2 + 1] : m_huff_count[2 + 0];

  temp1 = src[0] - m_last_dc_val[component_num];
  m_last_dc_val[component_num] = src[0];
  if (temp1 < 0) temp1 = -temp1;

  nbits = 0;
  while (temp1)
  {
    nbits++; temp1 >>= 1;
  }

  dc_count[nbits]++;
  for (run_len = 0, i = 1; i < 64; i++)
  {
    if ((temp1 = m_coefficient_array[i]) == 0)
      run_len++;
    else
    {
      while (run_len >= 16)
      {
        ac_count[0xF0]++;
        run_len -= 16;
      }
      if (temp1 < 0) temp1 = -temp1;
      nbits = 1;
      while (temp1 >>= 1) nbits++;
      ac_count[(run_len << 4) + nbits]++;
      run_len = 0;
    }
  }
  if (run_len) ac_count[0]++;
}